

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool __thiscall ON_4dRect::SubtractRect(ON_4dRect *this,ON_4dRect *rect1,ON_4dRect *rect2)

{
  bool bVar1;
  double dVar2;
  ON_4dRect *rect2_local;
  ON_4dRect *rect1_local;
  ON_4dRect *this_local;
  
  if (rect1 == (ON_4dRect *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this->left = rect1->left;
    this->top = rect1->top;
    this->right = rect1->right;
    this->bottom = rect1->bottom;
    bVar1 = IsRectEmpty(rect1);
    if (((bVar1) || (rect2 == (ON_4dRect *)0x0)) || (bVar1 = IsRectEmpty(rect2), bVar1)) {
      this_local._7_1_ = true;
    }
    else {
      if ((rect2->top <= rect1->top) && (rect1->bottom <= rect2->bottom)) {
        if (this->left < rect2->right) {
          dVar2 = ON_Min(rect2->right,this->right);
          this->left = dVar2;
        }
        if (rect2->left <= this->right && this->right != rect2->left) {
          dVar2 = ON_Max(this->left,rect2->left);
          this->right = dVar2;
        }
      }
      if ((rect2->left <= rect1->left) && (rect1->right <= rect2->right)) {
        if (this->top < rect2->bottom) {
          dVar2 = ON_Min(rect2->bottom,this->bottom);
          this->top = dVar2;
        }
        if (rect2->top <= this->bottom && this->bottom != rect2->top) {
          dVar2 = ON_Max(this->top,rect2->top);
          this->bottom = dVar2;
        }
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_4dRect::SubtractRect(const ON_4dRect* rect1, const ON_4dRect* rect2)
{
	if (rect1 == nullptr)
		return false;

	*this = *rect1;

	if (rect1->IsRectEmpty() || rect2 == nullptr || rect2->IsRectEmpty())
	{
		return true;
	}

	if (rect2->top <= rect1->top && rect2->bottom >= rect1->bottom)
	{
		if (left < rect2->right)
		{
			left = ON_Min(rect2->right, right);
		}
		if (right > rect2->left)
		{
			right = ON_Max(left, rect2->left);
		}
	}

	if (rect2->left <= rect1->left && rect2->right >= rect1->right)
	{
		if (top < rect2->bottom)
		{
			top = ON_Min(rect2->bottom, bottom);
		}
		if (bottom > rect2->top)
		{
			bottom = ON_Max(top, rect2->top);
		}
	}

	return true;
}